

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O0

realtype SUNRpowerI(realtype base,int exponent)

{
  int iVar1;
  undefined8 local_28;
  realtype prod;
  undefined4 local_18;
  int expt;
  int i;
  int exponent_local;
  realtype base_local;
  
  local_28 = 1.0;
  iVar1 = exponent;
  if (exponent < 1) {
    iVar1 = -exponent;
  }
  for (local_18 = 1; local_18 <= iVar1; local_18 = local_18 + 1) {
    local_28 = base * local_28;
  }
  if (exponent < 0) {
    local_28 = 1.0 / local_28;
  }
  return local_28;
}

Assistant:

realtype SUNRpowerI(realtype base, int exponent)
{
  int i, expt;
  realtype prod;

  prod = ONE;
  expt = abs(exponent);
  for(i = 1; i <= expt; i++) prod *= base;
  if (exponent < 0) prod = ONE/prod;
  return(prod);
}